

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::IC_Field> *objToStore,XSerializeEngine *serEng)

{
  XMLSize_t t;
  bool bVar1;
  IC_Field *pIVar2;
  size_t in_RCX;
  void *__buf;
  XMLSize_t getAt;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (objToStore->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fCurCount;
    XSerializeEngine::writeSize(serEng,t);
    if (t != 0) {
      getAt = 0;
      do {
        pIVar2 = BaseRefVectorOf<xercesc_4_0::IC_Field>::elementAt
                           (&objToStore->super_BaseRefVectorOf<xercesc_4_0::IC_Field>,getAt);
        XSerializeEngine::write(serEng,(int)pIVar2,__buf,in_RCX);
        getAt = getAt + 1;
      } while (t != getAt);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<IC_Field>* const objToStore
                                    , XSerializeEngine&            serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            IC_Field* data = objToStore->elementAt(i);
            serEng<<data;
        }
    }

}